

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O1

void re_init(re_context *ctx,errcxdef *errctx)

{
  ctx->errctx = errctx;
  ctx->next_state = 0;
  ctx->strbuf = (char *)0x0;
  ctx->tuple_arr = (re_tuple *)0x0;
  ctx->tuples_alloc = 0;
  ctx->cur_group = 0;
  return;
}

Assistant:

void re_init(re_context *ctx, errcxdef *errctx)
{
    /* save the error context */
    ctx->errctx = errctx;
    
    /* no tuple array yet */
    ctx->tuple_arr = 0;
    ctx->tuples_alloc = 0;

    /* clear states */
    ctx->next_state = RE_STATE_FIRST_VALID;

    /* clear groups */
    ctx->cur_group = 0;

    /* no string buffer yet */
    ctx->strbuf = 0;
}